

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void fill_MPP_FMT_RGB444(RK_U8 *p,RK_U32 R,RK_U32 G,RK_U32 B,RK_U32 be)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  
  bVar1 = (byte)(B >> 4) & 0xf | (byte)G & 0xf0;
  bVar3 = (byte)(R >> 4) & 0xf;
  bVar2 = bVar1;
  if (be != 0) {
    bVar2 = bVar3;
    bVar3 = bVar1;
  }
  *p = bVar2;
  p[1] = bVar3;
  return;
}

Assistant:

static void fill_MPP_FMT_RGB444(RK_U8 *p, RK_U32 R, RK_U32 G, RK_U32 B, RK_U32 be)
{
    // MPP_FMT_RGB444 = ffmpeg: rgb444be
    // 16 bit pixel     MSB  -------->  LSB
    //                 (0000,rrrr,gggg,bbbb)
    // big    endian   |  byte 0 |  byte 1 |
    // little endian   |  byte 1 |  byte 0 |
    RK_U16 val = (((R >> 4) & 0xf) << 8) |
                 (((G >> 4) & 0xf) << 4) |
                 (((B >> 4) & 0xf) << 0);
    if (be) {
        p[0] = (val >> 8) & 0xff;
        p[1] = (val >> 0) & 0xff;
    } else {
        p[0] = (val >> 0) & 0xff;
        p[1] = (val >> 8) & 0xff;
    }
}